

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O3

int gdImageColorAllocateAlpha(gdImagePtr im,int r,int g,int b,int a)

{
  ulong uVar1;
  uint uVar2;
  
  if (im->trueColor != 0) {
    return b + a * 0x1000000 + g * 0x100 + r * 0x10000;
  }
  uVar2 = im->colorsTotal;
  if (0 < (int)uVar2) {
    uVar1 = 0;
    do {
      if (im->open[uVar1] != 0) {
        uVar2 = (uint)uVar1;
        goto LAB_0010b475;
      }
      uVar1 = uVar1 + 1;
    } while (uVar2 != uVar1);
    if (uVar2 == 0x100) {
      return -1;
    }
  }
  im->colorsTotal = uVar2 + 1;
LAB_0010b475:
  im->red[(int)uVar2] = r;
  im->green[(int)uVar2] = g;
  im->blue[(int)uVar2] = b;
  im->alpha[(int)uVar2] = a;
  im->open[(int)uVar2] = 0;
  return uVar2;
}

Assistant:

BGD_DECLARE(int) gdImageColorAllocateAlpha (gdImagePtr im, int r, int g, int b, int a)
{
	int i;
	int ct = (-1);
	if (im->trueColor) {
		return gdTrueColorAlpha (r, g, b, a);
	}
	for (i = 0; (i < (im->colorsTotal)); i++) {
		if (im->open[i]) {
			ct = i;
			break;
		}
	}
	if (ct == (-1)) {
		ct = im->colorsTotal;
		if (ct == gdMaxColors) {
			return -1;
		}
		im->colorsTotal++;
	}
	im->red[ct] = r;
	im->green[ct] = g;
	im->blue[ct] = b;
	im->alpha[ct] = a;
	im->open[ct] = 0;
	return ct;
}